

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void ff_thief(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x1335,0xf,3,0,0x43,2,3,3,3,0,3,0,0x43,3,0x43,2,0x43);
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x13b4,0x4f,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,
         0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,
         0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x14b4,0x14,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14cd,0x1b,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,
         0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14ed,0x14,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0xa9,3,0x4a,0,0xab,3,0x4c,2,0xad,3,0x4e);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,
         0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,
         0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,2,0x35);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,
         0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,
         0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,2,0x45);
  vpatch(rom,0x1705,3,0,0x39);
  vpatch(rom,0x1a8b,9,0x37,0x17,0xf,0x35,0x27,0x1a,0x37,0xf,0x12);
  vpatch(rom,0x12300,0x7f,0,7,0xf,0x1f,0x17,0xf,9,5,7,0xf,0x1f,0x3f,0x3e,0x3c,0x1e,0x3a,0,0xe0,0xf0,
         0xf0,0xf0,0xf0,0x10,0xa0,0xe0,0xf0,0xf8,0xf8,0x38,0x28,0xe8,0x5c,0x77,0x73,0x71,0x30,0x10,
         0x1f,0x11,9,0x6c,0x4f,0x5f,0x3f,0x1f,0x11,0x1f,0xf,0xee,0xdf,0x8f,0x1f,0xf6,0x90,0xf8,0xfc,
         0x32,0xe1,0xf9,0xfd,0xf6,0xf0,0xf8,0xfc,0,7);
  vpatch(rom,0x12400,0x180,0,7,0x1f,0x2f,0x1f,0x17,1,5,7,0x1f,0x3f,0x7f,0x3f,0x3b,0x1e,10,0,0xc0,
         0xe0,0xf0,0xf0,0xf0,0xe0,0xc0,0xc0,0xe0,0xf0,0xf8,0xf8,0xf8,0xb0,0x30,0xf,7,8,9,9,7,2,4,8,7
         ,0xf,0xf,0xf,6,3,7,200,0x38,0xf8,0xf8,0xf8,0xf0,0x20,0x20,0xf8,0xf8,200,0x28,0x38,0xf0,0xe0
         ,0xe0,0,0);
  ff_spells(rom);
  return;
}

Assistant:

static void ff_thief(dw_rom *rom)
{
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x013b4,   79,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x014b4,   20,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014cd,   27,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014ed,   20,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    9,  0x37,  0x17,  0x0f,  0x35,  0x27,  0x1a,  0x37,  0x0f,  0x12);
    vpatch(rom, 0x12300,  127,  0x00,  0x07,  0x0f,  0x1f,  0x17,  0x0f,  0x09,  0x05,  0x07,  0x0f,  0x1f,  0x3f,  0x3e,  0x3c,  0x1e,  0x3a,  0x00,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0x10,  0xa0,  0xe0,  0xf0,  0xf8,  0xf8,  0x38,  0x28,  0xe8,  0x5c,  0x77,  0x73,  0x71,  0x30,  0x10,  0x1f,  0x11,  0x09,  0x6c,  0x4f,  0x5f,  0x3f,  0x1f,  0x11,  0x1f,  0x0f,  0xee,  0xdf,  0x8f,  0x1f,  0xf6,  0x90,  0xf8,  0xfc,  0x32,  0xe1,  0xf9,  0xfd,  0xf6,  0xf0,  0xf8,  0xfc,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x08,  0x05,  0x07,  0x0f,  0x1f,  0x1f,  0x1c,  0x14,  0x17,  0x3a,  0x00,  0xe0,  0xf0,  0xf8,  0xe8,  0xf0,  0x90,  0xa0,  0xe0,  0xf0,  0xf8,  0xfc,  0x7c,  0x3c,  0x78,  0x5c,  0x77,  0xfb,  0xf1,  0xf8,  0x6f,  0x09,  0x1f,  0x3f,  0x4c,  0x87,  0x9f,  0xbf,  0x6f,  0x0f,  0x1f,  0x3f,  0xee,  0xce,  0x8e,  0x0c,  0x08,  0xf8,  0x88,  0x90,  0x36,  0xf2,  0xfa,  0xfc,  0xf8,  0x88,  0xf8);
    vpatch(rom, 0x12400,  384,  0x00,  0x07,  0x1f,  0x2f,  0x1f,  0x17,  0x01,  0x05,  0x07,  0x1f,  0x3f,  0x7f,  0x3f,  0x3b,  0x1e,  0x0a,  0x00,  0xc0,  0xe0,  0xf0,  0xf0,  0xf0,  0xe0,  0xc0,  0xc0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xb0,  0x30,  0x0f,  0x07,  0x08,  0x09,  0x09,  0x07,  0x02,  0x04,  0x08,  0x07,  0x0f,  0x0f,  0x0f,  0x06,  0x03,  0x07,  0xc8,  0x38,  0xf8,  0xf8,  0xf8,  0xf0,  0x20,  0x20,  0xf8,  0xf8,  0xc8,  0x28,  0x38,  0xf0,  0xe0,  0xe0,  0x00,  0x00,  0x03,  0x1f,  0x2f,  0x1f,  0x17,  0x01,  0x00,  0x03,  0x1f,  0x3f,  0x7f,  0x3f,  0x3b,  0x1e,  0x00,  0x00,  0xc0,  0xe0,  0xf0,  0xf0,  0xf0,  0xe0,  0x00,  0xc0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xb0,  0x0f,  0x0f,  0x07,  0x08,  0x08,  0x1c,  0x23,  0x31,  0x0a,  0x08,  0x07,  0x0f,  0x0f,  0x1b,  0x3c,  0x3f,  0xf0,  0xc8,  0xa4,  0x7c,  0xfc,  0x3c,  0x5c,  0xc6,  0x30,  0xf8,  0xfc,  0xcc,  0xc4,  0xe4,  0xfc,  0xfe,  0x00,  0x00,  0x03,  0x07,  0x0f,  0x0f,  0x0f,  0x07,  0x00,  0x03,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x0d,  0x00,  0x00,  0xc0,  0xf8,  0xf4,  0xf8,  0xe8,  0x80,  0x00,  0xc0,  0xf8,  0xfc,  0xfe,  0xfc,  0xdc,  0x78,  0x0f,  0x13,  0x25,  0x3e,  0x3f,  0x3c,  0x3a,  0x63,  0x0c,  0x1f,  0x3f,  0x33,  0x23,  0x27,  0x3f,  0x7f,  0xf0,  0xf0,  0xe0,  0x10,  0x10,  0x38,  0xc4,  0x8c,  0x50,  0x10,  0xe0,  0xf0,  0xf0,  0xd8,  0x3c,  0xfc,  0x00,  0x03,  0x07,  0x0f,  0x0f,  0x0f,  0x07,  0x03,  0x03,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x0d,  0x0c,  0x00,  0xe0,  0xf8,  0xf4,  0xf8,  0xe8,  0x80,  0xa0,  0xe0,  0xf8,  0xfc,  0xfe,  0xfc,  0xdc,  0x78,  0x50,  0x13,  0x1c,  0x1f,  0x1f,  0x1f,  0x0f,  0x04,  0x04,  0x1f,  0x1f,  0x13,  0x14,  0x1c,  0x0f,  0x07,  0x07,  0xf0,  0xe0,  0x10,  0x90,  0x90,  0xe0,  0x40,  0x20,  0x10,  0xe0,  0xf0,  0xf0,  0xf0,  0x60,  0xc0,  0xe0,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x07,  0x03,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x1f,  0x00,  0xe0,  0xf0,  0xf8,  0xf8,  0xf0,  0xe0,  0xc0,  0xe0,  0xf0,  0xf8,  0xfc,  0xfc,  0xfc,  0xf0,  0xf8,  0x33,  0x70,  0x70,  0x30,  0x1f,  0x11,  0x11,  0x09,  0x2f,  0x4f,  0x5f,  0x3f,  0x11,  0x1f,  0x1f,  0x0f,  0xcc,  0x0e,  0x0e,  0x1e,  0xfc,  0x90,  0xf0,  0xf8,  0xf4,  0xf2,  0xf2,  0xfa,  0xfc,  0xf0,  0xf0,  0xf8,  0x00,  0x07,  0x0f,  0x1f,  0x1f,  0x0f,  0x07,  0x03,  0x07,  0x0f,  0x1f,  0x3f,  0x3f,  0x3f,  0x0f,  0x1f,  0x00,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xe0,  0xc0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf0,  0xf8,  0x33,  0x70,  0x70,  0x78,  0x3f,  0x09,  0x0f,  0x1f,  0x2f,  0x4f,  0x4f,  0x5f,  0x3f,  0x0f,  0x0f,  0x1f,  0xcc,  0x0e,  0x0e,  0x0c,  0xf8,  0x88,  0x88,  0x90,  0xf4,  0xf2,  0xfa,  0xfc,  0x88,  0xf8,  0xf8,  0xf0);
    ff_spells(rom);
}